

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChObjFileShape.cpp
# Opt level: O2

void __thiscall chrono::ChObjFileShape::ArchiveIN(ChObjFileShape *this,ChArchiveIn *marchive)

{
  ChNameValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  
  ChArchiveIn::VersionRead<chrono::ChObjFileShape>(marchive);
  ChVisualShape::ArchiveIN(&this->super_ChVisualShape,marchive);
  local_28._value = &this->filename;
  local_28._name = "filename";
  local_28._flags = '\0';
  ChArchiveIn::operator>>(marchive,&local_28);
  return;
}

Assistant:

void ChObjFileShape::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChObjFileShape>();
    // deserialize parent class
    ChVisualShape::ArchiveIN(marchive);
    // stream in all member data:
    marchive >> CHNVP(filename);
}